

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepTiledInputFile.cpp
# Opt level: O3

void __thiscall
Imf_3_2::DeepTiledInputFile::readTiles
          (DeepTiledInputFile *this,int dx1,int dx2,int dy1,int dy2,int lx,int ly)

{
  LineOrder LVar1;
  pthread_mutex_t *__mutex;
  Data *pDVar2;
  pointer ppTVar3;
  TileBuffer *pTVar4;
  InputStreamMutex *pIVar5;
  uint64_t uVar6;
  ulong uVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int n;
  bool bVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  uint64_t *puVar16;
  uint64_t uVar17;
  undefined4 extraout_var_00;
  char *pcVar18;
  Task *this_00;
  InputExc *pIVar19;
  ostream *poVar20;
  ArgExc *pAVar21;
  IoExc *this_01;
  long lVar22;
  long lVar23;
  int dx;
  string *psVar24;
  string *psVar25;
  int dy;
  ulong uVar26;
  stringstream _iex_throw_s;
  TaskGroup taskGroup;
  int local_340;
  undefined4 uStack_33c;
  ostream local_330 [376];
  TaskGroup local_1b8 [392];
  undefined4 extraout_var;
  
  __mutex = (pthread_mutex_t *)this->_data->_streamData;
  iVar13 = pthread_mutex_lock(__mutex);
  if (iVar13 != 0) {
    std::__throw_system_error(iVar13);
  }
  pDVar2 = this->_data;
  if ((pDVar2->slices).
      super__Vector_base<Imf_3_2::(anonymous_namespace)::TInSliceInfo_*,_std::allocator<Imf_3_2::(anonymous_namespace)::TInSliceInfo_*>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      (pDVar2->slices).
      super__Vector_base<Imf_3_2::(anonymous_namespace)::TInSliceInfo_*,_std::allocator<Imf_3_2::(anonymous_namespace)::TInSliceInfo_*>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    pAVar21 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_2::ArgExc::ArgExc(pAVar21,"No frame buffer specified as pixel data destination.");
    __cxa_throw(pAVar21,&Iex_3_2::ArgExc::typeinfo,Iex_3_2::ArgExc::~ArgExc);
  }
  if ((((ly | lx) < 0) ||
      (((lx != ly && ((pDVar2->tileDesc).mode == MIPMAP_LEVELS)) || (pDVar2->numXLevels <= lx)))) ||
     (pDVar2->numYLevels <= ly)) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream((stringstream *)&local_340);
    std::__ostream_insert<char,std::char_traits<char>>(local_330,"Level coordinate (",0x12);
    poVar20 = (ostream *)std::ostream::operator<<((ostream *)local_330,lx);
    std::__ostream_insert<char,std::char_traits<char>>(poVar20,", ",2);
    poVar20 = (ostream *)std::ostream::operator<<((ostream *)poVar20,ly);
    std::__ostream_insert<char,std::char_traits<char>>(poVar20,") is invalid.",0xd);
    pAVar21 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_2::ArgExc::ArgExc(pAVar21,(stringstream *)&local_340);
    __cxa_throw(pAVar21,&Iex_3_2::ArgExc::typeinfo,Iex_3_2::ArgExc::~ArgExc);
  }
  iVar13 = dx2;
  if (dx2 < dx1) {
    iVar13 = dx1;
  }
  if (dx1 < dx2) {
    dx2 = dx1;
  }
  dy = dy2;
  if (dy1 < dy2) {
    dy = dy1;
  }
  if (dy2 < dy1) {
    dy2 = dy1;
  }
  LVar1 = pDVar2->lineOrder;
  iVar8 = dy + -1;
  if (LVar1 != DECREASING_Y) {
    iVar8 = dy2 + 1;
  }
  IlmThread_3_2::TaskGroup::TaskGroup(local_1b8);
  if (LVar1 == DECREASING_Y) {
    dy = dy2;
  }
  if (dy != iVar8) {
    iVar14 = 0;
    do {
      uVar26 = (ulong)iVar14;
      iVar14 = ((iVar13 + 1) - dx2) + iVar14;
      dx = dx2;
      do {
        bVar12 = isValidTile(this,dx,dy,lx,ly);
        if (!bVar12) {
          iex_debugTrap();
          std::__cxx11::stringstream::stringstream((stringstream *)&local_340);
          std::__ostream_insert<char,std::char_traits<char>>(local_330,"Tile (",6);
          poVar20 = (ostream *)std::ostream::operator<<((ostream *)local_330,dx);
          std::__ostream_insert<char,std::char_traits<char>>(poVar20,", ",2);
          poVar20 = (ostream *)std::ostream::operator<<((ostream *)poVar20,dy);
          std::__ostream_insert<char,std::char_traits<char>>(poVar20,", ",2);
          poVar20 = (ostream *)std::ostream::operator<<((ostream *)poVar20,lx);
          std::__ostream_insert<char,std::char_traits<char>>(poVar20,",",1);
          poVar20 = (ostream *)std::ostream::operator<<((ostream *)poVar20,ly);
          std::__ostream_insert<char,std::char_traits<char>>(poVar20,") is not a valid tile.",0x16);
          pAVar21 = (ArgExc *)__cxa_allocate_exception(0x48);
          Iex_3_2::ArgExc::ArgExc(pAVar21,(stringstream *)&local_340);
          __cxa_throw(pAVar21,&Iex_3_2::ArgExc::typeinfo,Iex_3_2::ArgExc::~ArgExc);
        }
        pDVar2 = this->_data;
        ppTVar3 = (pDVar2->tileBuffers).
                  super__Vector_base<Imf_3_2::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_3_2::(anonymous_namespace)::TileBuffer_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pTVar4 = ppTVar3[uVar26 % (ulong)((long)(pDVar2->tileBuffers).
                                                super__Vector_base<Imf_3_2::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_3_2::(anonymous_namespace)::TileBuffer_*>_>
                                                ._M_impl.super__Vector_impl_data._M_finish -
                                          (long)ppTVar3 >> 3)];
        IlmThread_3_2::Semaphore::wait();
        pTVar4->dx = dx;
        pTVar4->dy = dy;
        pTVar4->lx = lx;
        pTVar4->ly = ly;
        pTVar4->uncompressedData = (char *)0x0;
        pIVar5 = pDVar2->_streamData;
        puVar16 = TileOffsets::operator()(&pDVar2->tileOffsets,dx,dy,lx,ly);
        uVar6 = *puVar16;
        if (uVar6 == 0) {
          iex_debugTrap();
          std::__cxx11::stringstream::stringstream((stringstream *)&local_340);
          std::__ostream_insert<char,std::char_traits<char>>(local_330,"Tile (",6);
          poVar20 = (ostream *)std::ostream::operator<<((ostream *)local_330,dx);
          std::__ostream_insert<char,std::char_traits<char>>(poVar20,", ",2);
          poVar20 = (ostream *)std::ostream::operator<<((ostream *)poVar20,dy);
          std::__ostream_insert<char,std::char_traits<char>>(poVar20,", ",2);
          poVar20 = (ostream *)std::ostream::operator<<((ostream *)poVar20,lx);
          std::__ostream_insert<char,std::char_traits<char>>(poVar20,", ",2);
          poVar20 = (ostream *)std::ostream::operator<<((ostream *)poVar20,ly);
          std::__ostream_insert<char,std::char_traits<char>>(poVar20,") is missing.",0xd);
          pIVar19 = (InputExc *)__cxa_allocate_exception(0x48);
          Iex_3_2::InputExc::InputExc(pIVar19,(stringstream *)&local_340);
          __cxa_throw(pIVar19,&Iex_3_2::InputExc::typeinfo,Iex_3_2::InputExc::~InputExc);
        }
        if ((pDVar2->version & 0x1000) == 0) {
          uVar17 = pIVar5->currentPosition;
        }
        else {
          iVar15 = (*pIVar5->is->_vptr_IStream[5])();
          uVar17 = CONCAT44(extraout_var,iVar15);
        }
        if (uVar17 != uVar6) {
          (*pIVar5->is->_vptr_IStream[6])(pIVar5->is,uVar6);
        }
        if (((pDVar2->version & 0x1000) != 0) &&
           ((*pIVar5->is->_vptr_IStream[3])(pIVar5->is,&local_340,4),
           local_340 != pDVar2->partNumber)) {
          iex_debugTrap();
          std::__cxx11::stringstream::stringstream((stringstream *)&local_340);
          std::__ostream_insert<char,std::char_traits<char>>
                    (local_330,"Unexpected part number ",0x17);
          poVar20 = (ostream *)std::ostream::operator<<((ostream *)local_330,local_340);
          std::__ostream_insert<char,std::char_traits<char>>(poVar20,", should be ",0xc);
          poVar20 = (ostream *)std::ostream::operator<<((ostream *)poVar20,pDVar2->partNumber);
          std::__ostream_insert<char,std::char_traits<char>>(poVar20,".",1);
          pAVar21 = (ArgExc *)__cxa_allocate_exception(0x48);
          Iex_3_2::ArgExc::ArgExc(pAVar21,(stringstream *)&local_340);
          __cxa_throw(pAVar21,&Iex_3_2::ArgExc::typeinfo,Iex_3_2::ArgExc::~ArgExc);
        }
        (*pIVar5->is->_vptr_IStream[3])(pIVar5->is,&local_340,4);
        iVar15 = local_340;
        (*pIVar5->is->_vptr_IStream[3])(pIVar5->is,&local_340,4);
        iVar9 = local_340;
        (*pIVar5->is->_vptr_IStream[3])(pIVar5->is,&local_340,4);
        iVar10 = local_340;
        (*pIVar5->is->_vptr_IStream[3])(pIVar5->is,&local_340,4);
        iVar11 = local_340;
        (*pIVar5->is->_vptr_IStream[3])(pIVar5->is,&local_340,8);
        n = local_340;
        lVar22 = CONCAT44(uStack_33c,local_340);
        (*pIVar5->is->_vptr_IStream[3])(pIVar5->is,&local_340,8);
        pTVar4->dataSize = CONCAT44(uStack_33c,local_340);
        (*pIVar5->is->_vptr_IStream[3])(pIVar5->is,&local_340,8);
        pTVar4->uncompressedDataSize = CONCAT44(uStack_33c,local_340);
        Xdr::skip<Imf_3_2::StreamIO,Imf_3_2::IStream>(pIVar5->is,n);
        if (dx != iVar15) {
          pIVar19 = (InputExc *)__cxa_allocate_exception(0x48);
          Iex_3_2::InputExc::InputExc(pIVar19,"Unexpected tile x coordinate.");
LAB_0016a269:
          __cxa_throw(pIVar19,&Iex_3_2::InputExc::typeinfo,Iex_3_2::InputExc::~InputExc);
        }
        if (iVar9 != dy) {
          pIVar19 = (InputExc *)__cxa_allocate_exception(0x48);
          Iex_3_2::InputExc::InputExc(pIVar19,"Unexpected tile y coordinate.");
          goto LAB_0016a269;
        }
        if (iVar10 != lx) {
          pIVar19 = (InputExc *)__cxa_allocate_exception(0x48);
          Iex_3_2::InputExc::InputExc(pIVar19,"Unexpected tile x level number coordinate.");
          goto LAB_0016a269;
        }
        if (iVar11 != ly) {
          pIVar19 = (InputExc *)__cxa_allocate_exception(0x48);
          Iex_3_2::InputExc::InputExc(pIVar19,"Unexpected tile y level number coordinate.");
          goto LAB_0016a269;
        }
        iVar15 = (*pIVar5->is->_vptr_IStream[2])();
        if ((char)iVar15 == '\0') {
          if (pTVar4->buffer != (char *)0x0) {
            operator_delete__(pTVar4->buffer);
          }
          uVar7 = pTVar4->dataSize;
          pcVar18 = (char *)operator_new__(uVar7);
          pTVar4->buffer = pcVar18;
          (*pIVar5->is->_vptr_IStream[3])(pIVar5->is,pcVar18,uVar7 & 0xffffffff);
        }
        else {
          iVar15 = (*pIVar5->is->_vptr_IStream[4])(pIVar5->is,(ulong)(uint)pTVar4->dataSize);
          pTVar4->buffer = (char *)CONCAT44(extraout_var_00,iVar15);
        }
        pIVar5->currentPosition = pTVar4->dataSize + uVar6 + lVar22 + 0x28;
        this_00 = (Task *)operator_new(0x20);
        IlmThread_3_2::Task::Task(this_00,local_1b8);
        *(undefined ***)this_00 = &PTR__TileBufferTask_003d64e8;
        *(Data **)(this_00 + 0x10) = pDVar2;
        *(TileBuffer **)(this_00 + 0x18) = pTVar4;
        IlmThread_3_2::ThreadPool::addGlobalTask(this_00);
        dx = dx + 1;
        uVar26 = uVar26 + 1;
      } while (iVar13 + 1 != dx);
      dy = dy + (uint)(LVar1 != DECREASING_Y) * 2 + -1;
    } while (dy != iVar8);
  }
  IlmThread_3_2::TaskGroup::~TaskGroup(local_1b8);
  ppTVar3 = (this->_data->tileBuffers).
            super__Vector_base<Imf_3_2::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_3_2::(anonymous_namespace)::TileBuffer_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  lVar22 = (long)(this->_data->tileBuffers).
                 super__Vector_base<Imf_3_2::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_3_2::(anonymous_namespace)::TileBuffer_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar3;
  if (lVar22 != 0) {
    lVar22 = lVar22 >> 3;
    lVar23 = 0;
    psVar24 = (string *)0x0;
    do {
      pTVar4 = ppTVar3[lVar23];
      psVar25 = (string *)&pTVar4->exception;
      if (psVar24 != (string *)0x0) {
        psVar25 = psVar24;
      }
      if (pTVar4->hasException == false) {
        psVar25 = psVar24;
      }
      pTVar4->hasException = false;
      lVar23 = lVar23 + 1;
      psVar24 = psVar25;
    } while (lVar22 + (ulong)(lVar22 == 0) != lVar23);
    if (psVar25 != (string *)0x0) {
      this_01 = (IoExc *)__cxa_allocate_exception(0x48);
      Iex_3_2::IoExc::IoExc(this_01,psVar25);
      __cxa_throw(this_01,&Iex_3_2::IoExc::typeinfo,Iex_3_2::IoExc::~IoExc);
    }
  }
  pthread_mutex_unlock(__mutex);
  return;
}

Assistant:

void
DeepTiledInputFile::readTiles (
    int dx1, int dx2, int dy1, int dy2, int lx, int ly)
{
    //
    // Read a range of tiles from the file into the framebuffer
    //

    try
    {
#if ILMTHREAD_THREADING_ENABLED
        std::lock_guard<std::mutex> lock (*_data->_streamData);
#endif
        if (_data->slices.size () == 0)
            throw IEX_NAMESPACE::ArgExc ("No frame buffer specified "
                                         "as pixel data destination.");

        if (!isValidLevel (lx, ly))
            THROW (
                IEX_NAMESPACE::ArgExc,
                "Level coordinate "
                "(" << lx
                    << ", " << ly
                    << ") "
                       "is invalid.");

        //
        // Determine the first and last tile coordinates in both dimensions.
        // We always attempt to read the range of tiles in the order that
        // they are stored in the file.
        //

        if (dx1 > dx2) std::swap (dx1, dx2);

        if (dy1 > dy2) std::swap (dy1, dy2);

        int dyStart = dy1;
        int dyStop  = dy2 + 1;
        int dY      = 1;

        if (_data->lineOrder == DECREASING_Y)
        {
            dyStart = dy2;
            dyStop  = dy1 - 1;
            dY      = -1;
        }

        //
        // Create a task group for all tile buffer tasks.  When the
        // task group goes out of scope, the destructor waits until
        // all tasks are complete.
        //

        {
            TaskGroup taskGroup;
            int       tileNumber = 0;

            for (int dy = dyStart; dy != dyStop; dy += dY)
            {
                for (int dx = dx1; dx <= dx2; dx++)
                {
                    if (!isValidTile (dx, dy, lx, ly))
                        THROW (
                            IEX_NAMESPACE::ArgExc,
                            "Tile (" << dx << ", " << dy << ", " << lx << ","
                                     << ly << ") is not a valid tile.");

                    ThreadPool::addGlobalTask (newTileBufferTask (
                        &taskGroup, _data, tileNumber++, dx, dy, lx, ly));
                }
            }

            //
            // finish all tasks
            //
        }

        //
        // Exception handling:
        //
        // TileBufferTask::execute() may have encountered exceptions, but
        // those exceptions occurred in another thread, not in the thread
        // that is executing this call to TiledInputFile::readTiles().
        // TileBufferTask::execute() has caught all exceptions and stored
        // the exceptions' what() strings in the tile buffers.
        // Now we check if any tile buffer contains a stored exception; if
        // this is the case then we re-throw the exception in this thread.
        // (It is possible that multiple tile buffers contain stored
        // exceptions.  We re-throw the first exception we find and
        // ignore all others.)
        //

        const string* exception = 0;

        for (size_t i = 0; i < _data->tileBuffers.size (); ++i)
        {
            TileBuffer* tileBuffer = _data->tileBuffers[i];

            if (tileBuffer->hasException && !exception)
                exception = &tileBuffer->exception;

            tileBuffer->hasException = false;
        }

        if (exception) throw IEX_NAMESPACE::IoExc (*exception);
    }
    catch (IEX_NAMESPACE::BaseExc& e)
    {
        REPLACE_EXC (
            e,
            "Error reading pixel data from image "
            "file \""
                << fileName () << "\". " << e.what ());
        throw;
    }
}